

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ValidationError::ValidationError
          (ValidationError *this,string *ename,string *msg,ExitCodes exit_code)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  ::std::__cxx11::string::string
            (&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ename);
  ::std::__cxx11::string::string
            (&bStack_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)msg);
  ParseError::ParseError(&this->super_ParseError,(string *)&local_48,(string *)&bStack_68,exit_code)
  ;
  ::std::__cxx11::string::~string((string *)&bStack_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  (this->super_ParseError).super_Error.super_runtime_error.super_exception._vptr_exception =
       (_func_int **)&PTR__Error_0026c578;
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}